

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O0

UINT8 k051649_waveform_r(void *chip,UINT8 offset)

{
  k051649_state *info;
  UINT8 offset_local;
  void *chip_local;
  
  info._7_1_ = offset;
  if ((*(byte *)((long)chip + 0x100) & 0xc0) != 0) {
    if (offset < 0x60) {
      if ((*(byte *)((long)chip + 0x100) & 0x40) != 0) {
        info._7_1_ = offset + (char)((uint)*(undefined4 *)
                                            ((long)chip + (long)((int)(uint)offset >> 5) * 0x2c + 8)
                                    >> 0x10);
      }
    }
    else {
      info._7_1_ = offset + (char)((uint)*(undefined4 *)
                                          ((long)chip +
                                          (long)(int)(((int)(uint)*(byte *)((long)chip + 0x100) >> 6
                                                      & 1U) + 3) * 0x2c + 8) >> 0x10);
    }
  }
  return *(UINT8 *)((long)chip +
                   (long)(int)(info._7_1_ & 0x1f) + (long)((int)(uint)info._7_1_ >> 5) * 0x2c + 0x12
                   );
}

Assistant:

static UINT8 k051649_waveform_r(void *chip, UINT8 offset)
{
	k051649_state *info = (k051649_state *)chip;
	
	// test-register bits 6/7 expose the internal counter
	if (info->test & 0xc0)
	{
		if (offset >= 0x60)
			offset += (info->channel_list[3 + (info->test >> 6 & 1)].counter >> FREQ_BITS);
		else if (info->test & 0x40)
			offset += (info->channel_list[offset>>5].counter >> FREQ_BITS);
	}
	return info->channel_list[offset>>5].waveram[offset&0x1f];
}